

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

void __thiscall
fasttext::ProductQuantizer::addcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  uint uVar1;
  float *pfVar2;
  real *prVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar1 = this->nsubq_;
  uVar5 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar5;
  }
  uVar6 = (ulong)this->dsub_;
  lVar9 = uVar6 * 4;
  for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
    prVar3 = get_centroids(this,(int32_t)uVar10,codes[uVar10 + (long)(int)(t * uVar1)]);
    if (uVar10 == uVar1 - 1) {
      uVar6 = (ulong)(uint)this->lastdsub_;
    }
    uVar4 = 0;
    if (0 < (int)uVar6) {
      uVar4 = uVar6 & 0xffffffff;
    }
    pfVar2 = (x->data_).mem_;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      *(float *)((long)pfVar2 + uVar7 * 4 + uVar5) =
           prVar3[uVar7] * alpha + *(float *)((long)pfVar2 + uVar7 * 4 + uVar5);
    }
    uVar5 = uVar5 + lVar9;
  }
  return;
}

Assistant:

void ProductQuantizer::addcode(
    Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      x[m * dsub_ + n] += alpha * c[n];
    }
  }
}